

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O2

void __thiscall
pstore::basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits>::basic_rotating_log
          (basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *this,
          string *base_name,streamoff max_size,uint num_backups,fstream_traits *stream_traits,
          file_system_traits *fs_traits)

{
  streamoff sVar1;
  
  basic_logger::basic_logger(&this->super_basic_logger);
  (this->super_basic_logger).super_logger._vptr_logger =
       (_func_int **)&PTR__basic_rotating_log_00168a88;
  sVar1 = 0;
  if (0 < max_size) {
    sVar1 = max_size;
  }
  this->max_size_ = sVar1;
  std::__cxx11::string::string((string *)&this->base_name_,(string *)base_name);
  this->num_backups_ = num_backups;
  std::ofstream::ofstream(&this->stream_);
  this->is_open_ = false;
  return;
}

Assistant:

basic_rotating_log<StreamTraits, FileSystemTraits>::basic_rotating_log (
        std::string base_name, std::streamoff const max_size, unsigned const num_backups,
        StreamTraits const & stream_traits, FileSystemTraits const & fs_traits)
            : max_size_ (std::max (max_size, std::streamoff{0}))
            , base_name_{std::move (base_name)}
            , num_backups_ (num_backups)
            , stream_ ()
            , stream_traits_ (stream_traits)
            , file_system_traits_ (fs_traits) {}